

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O2

bool __thiscall libtorrent::aux::torrent::ban_peer(torrent *this,torrent_peer *tp)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger
            [0x2e])();
  bVar1 = session_settings::get_bool((session_settings *)CONCAT44(extraout_var,iVar2),0x8032);
  if ((bVar1) || (-1 < *(int *)&tp->field_0x1b)) {
    need_peer_list(this);
    bVar1 = peer_list::ban_peer((this->super_torrent_hot_members).m_peer_list._M_t.
                                super___uniq_ptr_impl<libtorrent::aux::peer_list,_std::default_delete<libtorrent::aux::peer_list>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_libtorrent::aux::peer_list_*,_std::default_delete<libtorrent::aux::peer_list>_>
                                .super__Head_base<0UL,_libtorrent::aux::peer_list_*,_false>.
                                _M_head_impl,tp);
    if (bVar1) {
      update_want_peers(this);
      inc_stats_counter(this,0x31,1);
      return true;
    }
  }
  return false;
}

Assistant:

bool torrent::ban_peer(torrent_peer* tp)
	{
		if (!settings().get_bool(settings_pack::ban_web_seeds) && tp->web_seed)
			return false;

		need_peer_list();
		if (!m_peer_list->ban_peer(tp)) return false;
		update_want_peers();

		inc_stats_counter(counters::num_banned_peers);
		return true;
	}